

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wtmath.c
# Opt level: O3

int per_ext(double *sig,int len,int a,double *oup)

{
  double dVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  
  if (0 < len) {
    uVar4 = 0;
    do {
      oup[(long)a + uVar4] = sig[uVar4];
      uVar4 = uVar4 + 1;
    } while ((uint)len != uVar4);
  }
  iVar3 = len;
  if ((len & 1U) != 0) {
    iVar3 = len + 1;
    oup[len + a] = sig[(long)len + -1];
  }
  if (0 < a) {
    uVar4 = (ulong)(uint)a;
    iVar2 = a + iVar3;
    lVar5 = -8;
    uVar6 = 0;
    do {
      iVar2 = iVar2 + -1;
      dVar1 = oup[uVar4 + uVar6];
      *(double *)((long)oup + lVar5 + uVar4 * 8) = oup[iVar2];
      oup[(long)(iVar3 + a) + uVar6] = dVar1;
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + -8;
    } while (uVar4 != uVar6);
  }
  return iVar3;
}

Assistant:

int per_ext(double *sig, int len, int a, double *oup) {
	int i, len2;
	double temp1;
	double temp2;
	for (i = 0; i < len; ++i) {
		oup[a + i] = sig[i];
	}
	len2 = len;
	if ((len % 2) != 0) {
		len2 = len + 1;
		oup[a + len] = sig[len - 1];
	}
	for (i = 0; i < a; ++i) {
		temp1 = oup[a + i];
		temp2 = oup[a + len2 - 1 - i];
		oup[a - 1 - i] = temp2;
		oup[len2 + a + i] = temp1;
	}
	return len2;
}